

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O0

SampledSpectrum
pbrt::HairBxDF::SigmaAFromReflectance(SampledSpectrum *c,Float beta_n,SampledWavelengths *lambda)

{
  Float *pFVar1;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [64];
  int i;
  SampledSpectrum sigma_a;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffc4;
  undefined4 local_2c;
  undefined1 local_10 [16];
  undefined1 extraout_var [60];
  
  SampledSpectrum::SampledSpectrum((SampledSpectrum *)0x880bce);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    auVar5._0_4_ = SampledSpectrum::operator[]
                             ((SampledSpectrum *)
                              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                              (int)in_stack_ffffffffffffffbc);
    auVar5._4_60_ = extraout_var;
    dVar4 = std::log(auVar5._0_8_);
    in_stack_ffffffffffffffbc = 5.969 - in_XMM0_Da * 0.215;
    fVar2 = Sqr<float>(in_XMM0_Da);
    in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffbc + fVar2 * 2.532;
    fVar2 = Pow<3>(in_stack_ffffffffffffffc4);
    in_stack_ffffffffffffffc4 = in_stack_ffffffffffffffc0 - fVar2 * 10.73;
    fVar2 = Pow<4>(in_stack_ffffffffffffffc4);
    fVar2 = in_stack_ffffffffffffffc4 + fVar2 * 5.574;
    fVar3 = Pow<5>(in_stack_ffffffffffffffc4);
    fVar2 = Sqr<float>(SUB84(dVar4,0) / (fVar2 + fVar3 * 0.245));
    pFVar1 = SampledSpectrum::operator[]
                       ((SampledSpectrum *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        (int)in_stack_ffffffffffffffbc);
    *pFVar1 = fVar2;
  }
  return (array<float,_4>)(array<float,_4>)local_10;
}

Assistant:

PBRT_CPU_GPU SampledSpectrum HairBxDF::SigmaAFromReflectance(const SampledSpectrum &c, Float beta_n,
                                                const SampledWavelengths &lambda) {
    SampledSpectrum sigma_a;
    for (int i = 0; i < NSpectrumSamples; ++i)
        sigma_a[i] =
            Sqr(std::log(c[i]) / (5.969f - 0.215f * beta_n + 2.532f * Sqr(beta_n) -
                                  10.73f * Pow<3>(beta_n) + 5.574f * Pow<4>(beta_n) +
                                  0.245f * Pow<5>(beta_n)));
    return sigma_a;
}